

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O0

JPPV_sharedPtr __thiscall
JointPolicyPureVectorForClusteredBG::ToJointPolicyPureVector
          (JointPolicyPureVectorForClusteredBG *this)

{
  element_type *peVar1;
  type this_00;
  reference ppJVar2;
  type pJVar3;
  type this_01;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar4;
  JointPolicyPureVectorForClusteredBG *in_RSI;
  element_type *in_RDI;
  shared_ptr<const_PartialJointPolicyDiscretePure> sVar5;
  JPPV_sharedPtr JVar6;
  shared_ptr<const_JointPolicyDiscretePure> jp;
  Index t_inv;
  Index t;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  bgVec;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
  jpolBGVec;
  BGwCI_constPtr bg;
  JointPolicyPureVectorForClusteredBG *jpolBG;
  size_t h;
  PlanningUnitDecPOMDPDiscrete *pu;
  JPPV_sharedPtr *jppv;
  JointPolicyPureVectorForClusteredBG *in_stack_fffffffffffffe58;
  PlanningUnitDecPOMDPDiscrete *pu_00;
  JointPolicyPureVector *in_stack_fffffffffffffe60;
  shared_ptr<JointPolicyPureVector> *this_02;
  shared_ptr<const_BayesianGameWithClusterInfo> *in_stack_fffffffffffffe68;
  type in_stack_fffffffffffffe70;
  JointPolicyPureVector *in_stack_fffffffffffffe78;
  JointPolicyPureVector *in_stack_fffffffffffffe80;
  shared_ptr<const_JointPolicyDiscretePure> *this_03;
  shared_ptr<JointPolicyPureVector> local_f0;
  shared_ptr<JointPolicyPureVector> local_e0;
  undefined1 local_c8 [16];
  shared_ptr<const_JointPolicyDiscretePure> local_b8 [2];
  uint local_94;
  Index local_90;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  local_88;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_> local_68
  ;
  shared_ptr<const_BayesianGameWithClusterInfo> local_50;
  element_type *local_40;
  size_t local_38;
  byte local_19;
  PlanningUnitDecPOMDPDiscrete *local_18;
  
  this_00 = boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(&in_RSI->_m_bg);
  local_18 = BayesianGameForDecPOMDPStage::GetPUDecPOMDPDiscrete
                       (&this_00->super_BayesianGameForDecPOMDPStage);
  local_19 = 0;
  operator_new(0x98);
  JointPolicyPureVector::JointPolicyPureVector
            (in_stack_fffffffffffffe80,
             (Interface_ProblemToPolicyDiscretePure *)in_stack_fffffffffffffe78,
             (PolicyDomainCategory)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  boost::shared_ptr<JointPolicyPureVector>::shared_ptr<JointPolicyPureVector>
            ((shared_ptr<JointPolicyPureVector> *)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78);
  local_38 = PlanningUnit::GetHorizon((PlanningUnit *)local_18);
  local_40 = in_RSI;
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::shared_ptr
            ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8c81f9);
  std::allocator<const_JointPolicyDiscretePure_*>::allocator
            ((allocator<const_JointPolicyDiscretePure_*> *)0x8c8218);
  std::vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>::
  vector((vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
          *)in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78,
         (allocator_type *)in_stack_fffffffffffffe70);
  std::allocator<const_JointPolicyDiscretePure_*>::~allocator
            ((allocator<const_JointPolicyDiscretePure_*> *)0x8c823e);
  std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>::allocator
            ((allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_> *)0x8c825d);
  std::
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  ::vector((vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
            *)in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78,
           (allocator_type *)in_stack_fffffffffffffe70);
  std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>::~allocator
            ((allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_> *)0x8c8283);
  local_90 = 0;
  local_94 = 0;
  do {
    if (local_38 <= local_94) {
LAB_008c8582:
      this_02 = &local_f0;
      pu_00 = local_18;
      boost::shared_ptr<JointPolicyPureVector>::shared_ptr
                (this_02,(shared_ptr<JointPolicyPureVector> *)local_18);
      StartRecursiveConstructionPerAgent(in_RSI,pu_00,this_02,local_90,&local_68,&local_88);
      boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
                ((shared_ptr<JointPolicyPureVector> *)0x8c85e4);
      local_19 = 1;
      std::
      vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
      ::~vector((vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                 *)in_stack_fffffffffffffe70);
      std::vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
      ::~vector((vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                 *)in_stack_fffffffffffffe70);
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
                ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8c8613);
      sVar4.pi_ = extraout_RDX;
      if ((local_19 & 1) == 0) {
        boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
                  ((shared_ptr<JointPolicyPureVector> *)0x8c8676);
        sVar4.pi_ = extraout_RDX_00;
      }
      JVar6.pn.pi_ = sVar4.pi_;
      JVar6.px = in_RDI;
      return JVar6;
    }
    local_90 = ~local_94 + (int)local_38;
    GetBG(in_stack_fffffffffffffe58);
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=
              ((shared_ptr<const_BayesianGameWithClusterInfo> *)in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe68);
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
              ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8c8302);
    peVar1 = local_40;
    ppJVar2 = std::
              vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
              ::at((vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                    *)in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
    *ppJVar2 = (value_type)peVar1;
    std::
    vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
    ::at((vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
          *)in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=
              ((shared_ptr<const_BayesianGameWithClusterInfo> *)in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe68);
    if ((local_90 != 0) &&
       (local_40 = boost::shared_ptr<const_JointPolicyPureVectorForClusteredBG>::get
                             (&local_40->_m_prevJPolBG), local_40 == (element_type *)0x0)) {
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(&local_50);
      sVar5 = BayesianGameForDecPOMDPStageInterface::GetPastJointPolicy
                        ((BayesianGameForDecPOMDPStageInterface *)in_stack_fffffffffffffe58);
      this_03 = local_b8;
      boost::shared_ptr<JointPolicyDiscretePure_const>::
      shared_ptr<PartialJointPolicyDiscretePure_const>(this_03,local_c8,sVar5.pn.pi_.pi_);
      boost::shared_ptr<const_PartialJointPolicyDiscretePure>::~shared_ptr
                ((shared_ptr<const_PartialJointPolicyDiscretePure> *)0x8c83f2);
      pJVar3 = boost::shared_ptr<const_JointPolicyDiscretePure>::operator->(this_03);
      (*(pJVar3->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x14])(&local_e0);
      in_stack_fffffffffffffe70 = boost::shared_ptr<JointPolicyPureVector>::operator*(&local_e0);
      this_01 = boost::shared_ptr<JointPolicyPureVector>::operator*
                          ((shared_ptr<JointPolicyPureVector> *)in_RDI);
      JointPolicyPureVector::operator=(this_01,in_stack_fffffffffffffe60);
      boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
                ((shared_ptr<JointPolicyPureVector> *)0x8c8464);
      boost::shared_ptr<const_JointPolicyDiscretePure>::~shared_ptr
                ((shared_ptr<const_JointPolicyDiscretePure> *)0x8c8471);
      goto LAB_008c8582;
    }
    local_94 = local_94 + 1;
  } while( true );
}

Assistant:

JPPV_sharedPtr 
JointPolicyPureVectorForClusteredBG::ToJointPolicyPureVector() const
{
#if DEBUG_TOJPPV
    cout << ">>>JointPolicyPureVectorForClusteredBG::ToJointPolicyPureVector() started"<<endl;
#endif
    const PlanningUnitDecPOMDPDiscrete* pu = _m_bg->GetPUDecPOMDPDiscrete();
    JPPV_sharedPtr jppv = 
        JPPV_sharedPtr(
            new JointPolicyPureVector(pu, PolicyGlobals::OHIST_INDEX ));

    size_t h = pu->GetHorizon();
    
    const JointPolicyPureVectorForClusteredBG* jpolBG = this;
    BGwCI_constPtr bg;
    vector<const JointPolicyDiscretePure* > jpolBGVec(h);
    vector<BGwCI_constPtr> bgVec(h);
    Index t=0;
    //for(t=h-1; t >= 0; t--) //<- this never terminates (t is unsigned)
    for(Index t_inv = 0; t_inv < h; t_inv++)
    {
        t = h - 1 - t_inv;
        bg =  jpolBG->GetBG();
#if DEBUG_TOJPPV
        cout << ">>>t="<<t<<" jpolBG: "<< endl<< jpolBG->SoftPrint() <<endl;
        cout << ">>>corresponding BG:" << endl << bg->SoftPrint() << endl;
#endif
        jpolBGVec.at(t) = jpolBG;
        bgVec.at(t) = bg;
        if( t > 0  )
        {
            jpolBG = jpolBG->_m_prevJPolBG.get();
            if(jpolBG == 0)
            {
#if DEBUG_TOJPPV
                cout << ">>>t=" << t
                     << "apparently for stages 0...t a different type of policy is used" << endl;
#endif
                //apparently for stages 0...t a different type of policy is used
                //we get it from the BG:
                boost::shared_ptr<const JointPolicyDiscretePure> jp = bg->GetPastJointPolicy();
                *jppv = *(jp->ToJointPolicyPureVector());
                break;
            }
        }
    }
    // 
#if DEBUG_TOJPPV
    cout << ">>>About to start StartRecursiveConstructionPerAgent... t="<<t<<endl;
#endif

    StartRecursiveConstructionPerAgent(pu, jppv, t, jpolBGVec, bgVec);
    return jppv;

}